

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

int __thiscall OpenMD::StuntDouble::freeze(StuntDouble *this)

{
  bool bVar1;
  StuntDouble *in_RDI;
  StuntDouble *unaff_retaddr;
  int fdf;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  StuntDouble *frc;
  
  iVar2 = 3;
  frc = in_RDI;
  setVel(unaff_retaddr,(Vector3d *)in_RDI);
  setFrc(unaff_retaddr,(Vector3d *)frc);
  bVar1 = isDirectional((StuntDouble *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  if (bVar1) {
    setJ(unaff_retaddr,(Vector3d *)frc);
    setTrq(unaff_retaddr,(Vector3d *)frc);
    bVar1 = isLinear(in_RDI);
    if (bVar1) {
      iVar2 = iVar2 + 2;
    }
    else {
      iVar2 = iVar2 + 3;
    }
  }
  return iVar2;
}

Assistant:

int freeze() {
      int fdf = 3;

      setVel(V3Zero);
      setFrc(V3Zero);
      if (isDirectional()) {
        setJ(V3Zero);
        setTrq(V3Zero);
        if (isLinear())
          fdf += 2;
        else
          fdf += 3;
      }
      return fdf;
    }